

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double beta_cdf_inv_old(double cdf,double a,double b)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  double *pdVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  double *pdVar14;
  bool bVar15;
  double x;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  code *pcVar22;
  double adStack_d90 [20];
  double local_cf0 [17];
  double dStack_c68;
  code *apcStack_c60 [2];
  double d [380];
  
  if ((cdf < 0.0) || (1.0 < cdf)) {
    apcStack_c60[0] = (code *)0x194cf0;
    std::operator<<((ostream *)&std::cerr," \n");
    apcStack_c60[0] = (code *)0x194cff;
    std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV_OLD - Fatal error!\n");
    apcStack_c60[0] = (code *)0x194d0e;
    std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
    apcStack_c60[0] = beta_pdf;
    exit(1);
  }
  iVar2 = 2;
  dVar16 = a / (a + b);
  dVar21 = 0.0;
  do {
    x = dVar16;
    pdVar13 = local_cf0;
    bVar15 = iVar2 == 0;
    iVar2 = iVar2 + -1;
    if ((ABS((x - dVar21) / x) < 0.01) || (bVar15)) {
      return x;
    }
    apcStack_c60[0] = (code *)0x194a37;
    dVar16 = beta_cdf(x,a,b);
    apcStack_c60[0] = (code *)0x194a50;
    dVar17 = beta_pdf(x,a,b);
    dVar17 = (cdf - dVar16) / dVar17;
    dVar18 = ((b + -1.0) * dVar17) / (1.0 - x);
    dVar19 = ((1.0 - a) * dVar17) / x;
    d[0] = dVar18 + dVar19;
    dVar20 = (dVar18 + dVar19) * dVar17 * 0.5;
    dVar16 = x + dVar17 + dVar20;
    iVar7 = 0;
    uVar5 = 3;
    while ((dVar21 = x, 0.0001 < ABS(dVar20 / dVar16) && (uVar5 < 0x15))) {
      iVar4 = (int)uVar5;
      dVar18 = (dVar18 * (double)(iVar4 + -2) * dVar17) / (1.0 - x);
      dVar19 = (dVar19 * (2.0 - (double)iVar4) * dVar17) / dVar16;
      adStack_d90[uVar5 * 0x14] = dVar18 + dVar19;
      apcStack_c60[0] = (code *)0x3;
      pdVar3 = pdVar13;
      iVar1 = iVar7;
      for (lVar10 = 3; lVar12 = uVar5 - lVar10, lVar12 != 0; lVar10 = lVar10 + 1) {
        lVar11 = lVar12 * 0x14;
        dVar21 = d[0] * (&dStack_c68)[lVar10 + lVar11];
        dVar20 = 1.0;
        pdVar8 = pdVar3;
        iVar9 = iVar1;
        pdVar14 = d;
        for (lVar6 = 1; pdVar14 = pdVar14 + 0x14, lVar6 <= lVar12; lVar6 = lVar6 + 1) {
          dVar20 = (dVar20 * (double)iVar9) / (double)(int)lVar6;
          dVar21 = dVar21 + *pdVar14 * dVar20 * *pdVar8;
          iVar9 = iVar9 + -1;
          pdVar8 = pdVar8 + -0x14;
        }
        d[lVar11 + lVar10 + -2] = dVar21 + d[lVar10 + lVar11 + 0x11] / (double)((int)lVar10 + -1);
        iVar1 = iVar1 + -1;
        pdVar3 = pdVar3 + -0x13;
      }
      pcVar22 = (code *)(d[0] * (&dStack_c68)[uVar5] + d[uVar5 + 0x11] / (double)(iVar4 + -1));
      apcStack_c60[uVar5] = pcVar22;
      dVar20 = ((double)pcVar22 * dVar17) / (double)iVar4;
      dVar16 = dVar16 + dVar20;
      if (dVar16 <= 0.0) goto LAB_00194c8c;
      uVar5 = uVar5 + 1;
      iVar7 = iVar7 + 1;
      pdVar13 = pdVar13 + 0x14;
      if (1.0 <= dVar16) {
LAB_00194c8c:
        apcStack_c60[0] = (code *)0x194ca2;
        std::operator<<((ostream *)&std::cerr," \n");
        apcStack_c60[0] = (code *)0x194cb1;
        std::operator<<((ostream *)&std::cerr,"BETA_CDF_INV_OLD - Fatal error!\n");
        apcStack_c60[0] = (code *)0x194cc0;
        std::operator<<((ostream *)&std::cerr,"  The series has diverged.\n");
        return -1.0;
      }
    }
  } while( true );
}

Assistant:

double beta_cdf_inv_old ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_CDF_INV_OLD inverts the Beta CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    22 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by Abernathy and Smith.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Abernathy, Smith,
//    Algorithm 724,
//    ACM Transactions on Mathematical Software,
//    Volume 19, Number 4, December 1993, pages 481-483.
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Output, double BETA_CDF_INV, the argument of the CDF.
//
{
# define MAXK 20

  double bcoeff;
  double cdf_x;
  double d[MAXK * (MAXK-1)];
  double error = 0.0001;
  double errapp = 0.01;
  int i;
  int j;
  int k;
  int loopct;
  double pdf_x;
  double q;
  double s1;
  double s2;
  double sum2;
  double t;
  double tail;
  double x;
  double xold;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "BETA_CDF_INV_OLD - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }
//
//  Estimate the solution.
//
  x = a / ( a + b );

  xold = 0.0;
  loopct = 2;

  while ( errapp <= fabs ( ( x - xold ) / x ) && loopct != 0 )
  {
    xold = x;
    loopct = loopct - 1;
//
//  CDF_X = PROB { BETA(A,B) <= X }.
//  Q = ( CDF - CDF_X ) / PDF_X.
//
    cdf_x = beta_cdf ( x, a, b );

    pdf_x = beta_pdf ( x, a, b );

    q = ( cdf - cdf_x ) / pdf_x;
//
//  D(N,K) = C(N,K) * Q**(N+K-1) / (N-1)!
//
    t = 1.0 - x;
    s1 = q * ( b - 1.0 ) / t;
    s2 = q * ( 1.0 - a ) / x;
    d[2-1+0*MAXK] = s1 + s2;
    tail = d[2-1+0*MAXK] * q / 2.0;
    x = x + q + tail;

    k = 3;

    while ( error < fabs ( tail / x ) && k <= MAXK )
    {
//
//  Find D(2,K-2).
//
      s1 = q * ( static_cast<double>(k ) - 2.0 ) * s1 / t;
      s2 = q * ( 2.0 - static_cast<double>(k ) ) * s2 / x;
      d[2-1+(k-2)*MAXK] = s1 + s2;
//
//  Find D(3,K-3), D(4,K-4), D(5,K-5), ... , D(K-1,1).
//
      for ( i = 3; i <= k-1; i++ )
      {
        sum2 = d[2-1+0*MAXK] * d[i-2+(k-i)*MAXK];
        bcoeff = 1.0;

        for ( j = 1; j <= k - i; j++ )
        {
          bcoeff = ( bcoeff * static_cast<double>(k - i - j + 1 ) )
            / static_cast<double>(j );
          sum2 = sum2 + bcoeff * d[2-1+j*MAXK] * d[i-2+(k-i-j)*MAXK];
        }
        d[i-1+(k-i)*MAXK] = sum2 + d[i-2+(k-i+1)*MAXK] / static_cast<double>(i - 1 );
      }
//
//  Compute D(K,0) and use it to expand the series.
//
      d[k-1+0*MAXK] = d[2-1+0*MAXK] * d[k-2+0*MAXK] + d[k-2+1*MAXK]
        / static_cast<double>(k - 1 );
      tail = d[k-1+0*MAXK] * q / static_cast<double>(k );
      x = x + tail;
//
//  Check for divergence.
//
      if ( x <= 0.0 || 1.0 <= x )
      {
        cerr << " \n";
        cerr << "BETA_CDF_INV_OLD - Fatal error!\n";
        cerr << "  The series has diverged.\n";
        x = -1.0;
        return x;
      }
      k = k + 1;
    }
  }
  return x;
# undef MAXK
}